

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Bundle::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Bundle *this)

{
  bool bVar1;
  ostream *this_00;
  reference this_01;
  Header7 *pHVar2;
  string local_1f0 [32];
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
  local_1d0;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
  local_1c8;
  const_iterator citrRefEnd;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
  local_1b8;
  const_iterator citrRef;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Bundle *local_18;
  Bundle *this_local;
  
  local_18 = this;
  this_local = (Bundle *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"***************************************************************");
  this_00 = std::operator<<(local_190,"PDU Bundle.\nTotal Length: ");
  std::ostream::operator<<(this_00,this->m_ui16Length);
  std::operator<<(local_190,"***************************************************************");
  citrRefEnd._M_current =
       (KRef_Ptr<KDIS::PDU::Header7> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
       ::begin(&this->m_vRefHeaders);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>>>>
              *)&local_1b8,
             (__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
              *)&citrRefEnd);
  local_1d0._M_current =
       (KRef_Ptr<KDIS::PDU::Header7> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
       ::end(&this->m_vRefHeaders);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>>>>
              *)&local_1c8,&local_1d0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_1b8,&local_1c8);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
              ::operator*(&local_1b8);
    pHVar2 = UTILS::KRef_Ptr<KDIS::PDU::Header7>::operator->(this_01);
    (*(pHVar2->super_Header6)._vptr_Header6[2])(local_1f0);
    std::operator<<(local_190,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
    ::operator++(&local_1b8);
  }
  std::operator<<(local_190,"***************************************************************");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Bundle::GetAsString()
{
    KStringStream ss;

    ss << "***************************************************************";
    ss << "PDU Bundle.\nTotal Length: " << m_ui16Length;
    ss << "***************************************************************";

    // We only print the PDU, no point in printing the streams.

    //vector<KDataStream>::const_iterator citrObj = m_vStreams.begin();
    //vector<KDataStream>::const_iterator citrObjEnd = m_vStreams.end();
    //for( ; citrObj != citrObjEnd; ++citrObj )
    //{
    //	ss << citrObj->GetAsString();
    //}

    vector<PduPtr>::const_iterator citrRef = m_vRefHeaders.begin();
    vector<PduPtr>::const_iterator citrRefEnd = m_vRefHeaders.end();
    for( ; citrRef != citrRefEnd; ++citrRef )
    {
        ss << ( *citrRef )->GetAsString();
    }

    ss << "***************************************************************";

    return ss.str();
}